

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

char * fmt::v7::detail::
       parse_precision<char,fmt::v7::detail::specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,fmt::v7::detail::error_handler>,fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>>&>
                 (char *begin,char *end,
                 specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_>
                 *handler)

{
  type tVar1;
  int iVar2;
  error_handler *this;
  precision_adapter<fmt::v7::detail::specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_>_&,_char>
  local_28;
  error_handler *local_20;
  
  local_20 = (error_handler *)(begin + 1);
  if (local_20 != (error_handler *)end) {
    if ((int)(char)*local_20 - 0x30U < 10) {
      this = (error_handler *)&local_20;
      iVar2 = parse_nonnegative_int<char,fmt::v7::detail::specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,fmt::v7::detail::error_handler>,fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>>&>
                        ((char **)this,end,handler);
      ((handler->
       super_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
       ).super_specs_setter<char>.specs_)->precision = iVar2;
    }
    else {
      if (*local_20 != (error_handler)0x7b) goto LAB_002354a8;
      this = (error_handler *)(begin + 2);
      if (this != (error_handler *)end) {
        local_28.handler = handler;
        this = (error_handler *)
               parse_arg_id<char,fmt::v7::detail::precision_adapter<fmt::v7::detail::specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,fmt::v7::detail::error_handler>,fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>>&,char>>
                         ((char *)this,end,&local_28);
      }
      if ((this == (error_handler *)end) || (local_20 = this + 1, *this != (error_handler)0x7d)) {
        error_handler::on_error(this,"invalid format string");
      }
    }
    tVar1 = (handler->checker_).arg_type_;
    if ((tVar1 < custom_type) && ((0x41feU >> (tVar1 & 0x1f) & 1) != 0)) {
      error_handler::on_error(this,"precision not allowed for this argument type");
    }
    return (char *)local_20;
  }
LAB_002354a8:
  error_handler::on_error((error_handler *)begin,"missing precision specifier");
}

Assistant:

FMT_CONSTEXPR const Char* parse_precision(const Char* begin, const Char* end,
                                          Handler&& handler) {
  ++begin;
  auto c = begin != end ? *begin : Char();
  if ('0' <= c && c <= '9') {
    handler.on_precision(parse_nonnegative_int(begin, end, handler));
  } else if (c == '{') {
    ++begin;
    if (begin != end) {
      begin =
          parse_arg_id(begin, end, precision_adapter<Handler, Char>(handler));
    }
    if (begin == end || *begin++ != '}')
      return handler.on_error("invalid format string"), begin;
  } else {
    return handler.on_error("missing precision specifier"), begin;
  }
  handler.end_precision();
  return begin;
}